

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall BoolValue::BoolValue(BoolValue *this,bool value)

{
  SimpleType *this_00;
  string *namee;
  allocator<char> local_25 [20];
  byte local_11;
  BoolValue *pBStack_10;
  bool value_local;
  BoolValue *this_local;
  
  local_11 = value;
  pBStack_10 = this;
  Value::Value(&this->super_Value);
  (this->super_Value).super_Base._vptr_Base = (_func_int **)&PTR_accept_0016c4c0;
  this->value = (bool)(local_11 & 1);
  this_00 = (SimpleType *)operator_new(0x18);
  namee = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)namee,"bool",local_25);
  SimpleType::SimpleType(this_00,namee);
  (this->super_Value).type = this_00;
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

BoolValue::BoolValue(bool value): value(value)
{
    type = new SimpleType(new std::string("bool"));
}